

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

boolean revive_nasty(int x,int y,char *msg)

{
  obj *poVar1;
  monst *pmVar2;
  boolean bVar3;
  boolean bVar4;
  uint uVar5;
  obj *corpse;
  coord cc;
  coord local_52;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  char *local_38;
  
  local_40 = (long)y;
  bVar3 = '\0';
  local_4c = (int)(char)x;
  local_50 = (int)(char)y;
  poVar1 = level->objects[x][local_40];
  local_48 = x;
  local_44 = y;
  local_38 = msg;
  while (corpse = poVar1, corpse != (obj *)0x0) {
    poVar1 = (corpse->v).v_nexthere;
    if (((corpse->otyp == 0x10e) && (uVar5 = corpse->corpsenm - 0x128, uVar5 < 0x1f)) &&
       ((0x70000001U >> (uVar5 & 0x1f) & 1) != 0)) {
      pmVar2 = level->monsters[x][local_40];
      if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
        bVar3 = enexto(&local_52,level,(xchar)local_4c,(xchar)local_50,pmVar2->data);
        if (bVar3 != '\0') {
          rloc_to(pmVar2,level,(int)local_52.x,(int)local_52.y);
        }
      }
      if (local_38 != (char *)0x0) {
        Norep("%s");
      }
      bVar3 = revive_corpse(corpse);
    }
  }
  if (bVar3 != '\0') {
    pmVar2 = level->monsters[x][local_40];
    if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
      bVar4 = goodpos(level,local_48,local_44,pmVar2,0);
      if (bVar4 == '\0') {
        bVar4 = enexto(&local_52,level,(xchar)local_4c,(xchar)local_50,pmVar2->data);
        if (bVar4 != '\0') {
          rloc_to(pmVar2,level,(int)local_52.x,(int)local_52.y);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

boolean revive_nasty(int x, int y, const char *msg)
{
    struct obj *otmp, *otmp2;
    struct monst *mtmp;
    coord cc;
    boolean revived = FALSE;

    for (otmp = level->objects[x][y]; otmp; otmp = otmp2) {
	otmp2 = otmp->nexthere;
	if (otmp->otyp == CORPSE &&
	    (is_rider(&mons[otmp->corpsenm]) ||
	     otmp->corpsenm == PM_WIZARD_OF_YENDOR)) {
	    /* move any living monster already at that location */
	    if ((mtmp = m_at(level, x,y)) && enexto(&cc, level, x, y, mtmp->data))
		rloc_to(mtmp, level, cc.x, cc.y);
	    if (msg) Norep("%s", msg);
	    revived = revive_corpse(otmp);
	}
    }

    /* this location might not be safe, if not, move revived monster */
    if (revived) {
	mtmp = m_at(level, x,y);
	if (mtmp && !goodpos(level, x, y, mtmp, 0) &&
	    enexto(&cc, level, x, y, mtmp->data)) {
	    rloc_to(mtmp, level, cc.x, cc.y);
	}
	/* else impossible? */
    }

    return revived;
}